

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

string * __thiscall
flatbuffers::BinaryAnnotator::BuildUnion_abi_cxx11_
          (string *__return_storage_ptr__,BinaryAnnotator *this,uint64_t union_offset,
          uint8_t realized_type,Field *field)

{
  ushort uVar1;
  string *psVar2;
  bool bVar3;
  ulong uVar4;
  Schema *pSVar5;
  Schema *pSVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  size_type *psVar11;
  char *__function;
  long lVar12;
  Object *table;
  Schema *pSVar13;
  Field *pFVar14;
  long lVar15;
  unsigned_short vtsize;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  allocator<char> local_139;
  BinaryAnnotator *local_138;
  uint64_t local_130;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_128;
  string *local_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  string local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  string local_a8;
  BinarySection local_88;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  pSVar13 = this->schema_;
  lVar12 = -(long)*(int *)pSVar13;
  uVar1 = *(ushort *)(pSVar13 + -(long)*(int *)pSVar13);
  if ((uVar1 < 7) || (uVar4 = (ulong)*(ushort *)(pSVar13 + lVar12 + 6), uVar4 == 0)) {
    pSVar5 = (Schema *)0x0;
  }
  else {
    pSVar5 = pSVar13 + *(uint *)(pSVar13 + uVar4) + uVar4;
  }
  lVar15 = -(long)*(int *)field;
  if ((*(ushort *)(field + -(long)*(int *)field) < 7) ||
     (uVar4 = (ulong)*(ushort *)(field + lVar15 + 6), uVar4 == 0)) {
    pFVar14 = (Field *)0x0;
  }
  else {
    pFVar14 = field + *(uint *)(field + uVar4) + uVar4;
  }
  if (((*(ushort *)(pFVar14 + -(long)*(int *)pFVar14) < 9) ||
      ((ulong)*(ushort *)(pFVar14 + (8 - (long)*(int *)pFVar14)) == 0)) ||
     (*(uint *)pSVar5 <= *(uint *)(pFVar14 + *(ushort *)(pFVar14 + (8 - (long)*(int *)pFVar14))))) {
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Enum>, SizeT = unsigned int]"
    ;
  }
  else {
    uVar4 = (ulong)(*(uint *)(pFVar14 + *(ushort *)(pFVar14 + (8 - (long)*(int *)pFVar14))) << 2);
    lVar9 = *(uint *)(pSVar5 + uVar4 + 4) + uVar4;
    pSVar6 = pSVar5 + lVar9 + 4;
    if ((*(ushort *)(pSVar6 + -(long)*(int *)pSVar6) < 7) ||
       (uVar4 = (ulong)*(ushort *)(pSVar5 + ((lVar9 + 10) - (long)*(int *)pSVar6)), uVar4 == 0)) {
      pSVar6 = (Schema *)0x0;
    }
    else {
      pSVar6 = pSVar6 + *(uint *)(pSVar6 + uVar4) + uVar4;
    }
    local_110 = __return_storage_ptr__;
    if ((uint)realized_type < *(uint *)pSVar6) {
      lVar9 = (ulong)*(uint *)(pSVar6 + (ulong)realized_type * 4 + 4) + (ulong)realized_type * 4;
      pSVar5 = pSVar6 + lVar9 + 4;
      local_138 = this;
      local_130 = union_offset;
      bVar3 = ContainsSection(this,union_offset);
      lVar8 = -(long)*(int *)pSVar5;
      if (bVar3) {
        uVar1 = *(ushort *)(pSVar6 + lVar8 + lVar9 + 8);
      }
      else {
        if (*(ushort *)(pSVar5 + -(long)*(int *)pSVar5) < 0xb) {
          pSVar6 = (Schema *)0x0;
        }
        else {
          uVar4 = (ulong)*(ushort *)(pSVar6 + lVar8 + lVar9 + 0xe);
          if (uVar4 == 0) {
            pSVar6 = (Schema *)0x0;
          }
          else {
            pSVar6 = pSVar5 + *(uint *)(pSVar5 + uVar4) + uVar4;
          }
        }
        if (4 < *(ushort *)(pSVar6 + -(long)*(int *)pSVar6)) {
          lVar9 = -(long)*(int *)pSVar6;
          if (((ulong)*(ushort *)(pSVar6 + lVar9 + 4) != 0) &&
             (pSVar6[*(ushort *)(pSVar6 + lVar9 + 4)].super_Table == (Table)0xf)) {
            if ((uVar1 < 5) || (uVar4 = (ulong)*(ushort *)(pSVar13 + lVar12 + 4), uVar4 == 0)) {
              pSVar13 = (Schema *)0x0;
            }
            else {
              pSVar13 = pSVar13 + *(uint *)(pSVar13 + uVar4) + uVar4;
            }
            if (((*(ushort *)(pSVar6 + -(long)*(int *)pSVar6) < 9) ||
                ((ulong)*(ushort *)(pSVar6 + lVar9 + 8) == 0)) ||
               (*(uint *)pSVar13 <= *(uint *)(pSVar6 + *(ushort *)(pSVar6 + lVar9 + 8)))) {
              __function = 
              "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
              ;
              goto LAB_0030ff73;
            }
            uVar4 = (ulong)(*(uint *)(pSVar6 + *(ushort *)(pSVar6 + lVar9 + 8)) << 2);
            lVar12 = *(uint *)(pSVar13 + uVar4 + 4) + uVar4;
            table = (Object *)(pSVar13 + lVar12 + 4);
            if (((*(ushort *)(table + -(long)*(int *)table) < 9) ||
                ((ulong)*(ushort *)(pSVar13 + ((lVar12 + 0xc) - (long)*(int *)table)) == 0)) ||
               (table[*(ushort *)(pSVar13 + ((lVar12 + 0xc) - (long)*(int *)table))].super_Table ==
                (Table)0x0)) {
              BuildTable(local_138,local_130,Table,table);
            }
            else {
              local_128.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_128.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a8,
                         (char *)(field + (ulong)*(uint *)(field + *(ushort *)(field + lVar15 + 4))
                                          + 4 + (ulong)*(ushort *)(field + lVar15 + 4)),
                         (allocator<char> *)&local_88);
              BuildStruct(local_138,local_130,&local_128,&local_a8,table);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_c8,
                         (char *)(table + (ulong)*(uint *)(table + *(ushort *)
                                                                    (table + (4 - (long)*(int *)
                                                  table))) +
                                          (ulong)*(ushort *)(table + (4 - (long)*(int *)table)) + 4)
                         ,&local_139);
              plVar7 = (long *)std::__cxx11::string::append((char *)local_c8);
              plVar10 = plVar7 + 2;
              if ((long *)*plVar7 == plVar10) {
                local_f8 = *plVar10;
                lStack_f0 = plVar7[3];
                local_108 = &local_f8;
              }
              else {
                local_f8 = *plVar10;
                local_108 = (long *)*plVar7;
              }
              local_100 = plVar7[1];
              *plVar7 = (long)plVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_108);
              psVar11 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_e8.field_2._M_allocated_capacity = *psVar11;
                local_e8.field_2._8_8_ = plVar7[3];
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              }
              else {
                local_e8.field_2._M_allocated_capacity = *psVar11;
                local_e8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_e8._M_string_length = plVar7[1];
              *plVar7 = (long)psVar11;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              local_48.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_128.
                   super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_48.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_128.
                   super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_48.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_128.
                   super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_128.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_128.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              anon_unknown_49::MakeBinarySection(&local_88,&local_e8,Union,&local_48);
              AddSection(local_138,local_130,&local_88);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              ~vector(&local_88.regions);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
                operator_delete(local_88.name._M_dataplus._M_p,
                                local_88.name.field_2._M_allocated_capacity + 1);
              }
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              ~vector(&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_108 != &local_f8) {
                operator_delete(local_108,local_f8 + 1);
              }
              if (local_c8[0] != local_b8) {
                operator_delete(local_c8[0],local_b8[0] + 1);
              }
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              ~vector(&local_128);
            }
          }
        }
        uVar1 = *(ushort *)(pSVar5 + (4 - (long)*(int *)pSVar5));
      }
      psVar2 = local_110;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_110,
                 (char *)(pSVar5 + (ulong)*(uint *)(pSVar5 + uVar1) + (ulong)uVar1 + 4),
                 (allocator<char> *)&local_88);
      return psVar2;
    }
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::EnumVal>, SizeT = unsigned int]"
    ;
  }
LAB_0030ff73:
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,__function);
}

Assistant:

std::string BinaryAnnotator::BuildUnion(const uint64_t union_offset,
                                        const uint8_t realized_type,
                                        const reflection::Field *const field) {
  const reflection::Enum *next_enum =
      schema_->enums()->Get(field->type()->index());

  const reflection::EnumVal *enum_val = next_enum->values()->Get(realized_type);

  if (ContainsSection(union_offset)) { return enum_val->name()->c_str(); }

  const reflection::Type *union_type = enum_val->union_type();

  if (union_type->base_type() == reflection::BaseType::Obj) {
    const reflection::Object *object =
        schema_->objects()->Get(union_type->index());

    if (object->is_struct()) {
      // Union of vectors point to a new Binary section
      std::vector<BinaryRegion> regions;

      BuildStruct(union_offset, regions, field->name()->c_str(), object);

      AddSection(
          union_offset,
          MakeBinarySection(std::string(object->name()->c_str()) + "." +
                                field->name()->c_str(),
                            BinarySectionType::Union, std::move(regions)));
    } else {
      BuildTable(union_offset, BinarySectionType::Table, object);
    }
  }
  // TODO(dbaileychess): handle the other union types.

  return enum_val->name()->c_str();
}